

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlAddEncodingAlias(void)

{
  int val;
  char *val_00;
  char *val_01;
  undefined4 local_2c;
  int n_alias;
  char *alias;
  int n_name;
  char *name;
  int ret_val;
  int test_ret;
  
  for (alias._4_4_ = 0; alias._4_4_ < 4; alias._4_4_ = alias._4_4_ + 1) {
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      val_00 = gen_const_char_ptr(alias._4_4_,0);
      val_01 = gen_const_char_ptr(local_2c,1);
      val = xmlAddEncodingAlias(val_00,val_01);
      desret_int(val);
      call_tests = call_tests + 1;
      des_const_char_ptr(alias._4_4_,val_00,0);
      des_const_char_ptr(local_2c,val_01,1);
      xmlResetLastError();
    }
  }
  function_tests = function_tests + 1;
  return 0;
}

Assistant:

static int
test_xmlAddEncodingAlias(void) {
    int test_ret = 0;

    int ret_val;
    char * name; /* the encoding name as parsed, in UTF-8 format (ASCII actually) */
    int n_name;
    char * alias; /* the alias name as parsed, in UTF-8 format (ASCII actually) */
    int n_alias;

    for (n_name = 0;n_name < gen_nb_const_char_ptr;n_name++) {
    for (n_alias = 0;n_alias < gen_nb_const_char_ptr;n_alias++) {
        name = gen_const_char_ptr(n_name, 0);
        alias = gen_const_char_ptr(n_alias, 1);

        ret_val = xmlAddEncodingAlias((const char *)name, (const char *)alias);
        desret_int(ret_val);
        call_tests++;
        des_const_char_ptr(n_name, (const char *)name, 0);
        des_const_char_ptr(n_alias, (const char *)alias, 1);
        xmlResetLastError();
    }
    }
    function_tests++;

    return(test_ret);
}